

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::renderQuad
          (TextureBorderClampTest *this,float *texCoord,ReferenceParams *samplerParams)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  deUint32 program;
  int iVar2;
  undefined4 uVar3;
  TextureRenderer *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  float *pfVar5;
  VertexArrayBinding *local_200;
  PrimitiveList local_158;
  deUint32 local_13c;
  long lStack_138;
  deUint32 progId;
  Functions *gl;
  string local_128;
  allocator<char> local_f1;
  string local_f0;
  void **local_d0;
  undefined1 local_c8 [8];
  VertexArrayBinding vertexArrays [2];
  ReferenceParams *samplerParams_local;
  float *texCoord_local;
  TextureBorderClampTest *this_local;
  
  if (this->m_samplingFunction == SAMPLE_FILTER) {
    this_00 = de::details::
              UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
              ::operator->(&(this->m_renderer).
                            super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
                          );
    gls::TextureTestUtil::TextureRenderer::renderQuad
              (this_00,0,texCoord,&samplerParams->super_RenderParams);
  }
  else {
    gl._6_1_ = 1;
    local_d0 = (void **)local_c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"a_position",&local_f1);
    glu::va::Float((VertexArrayBinding *)local_c8,&local_f0,4,4,0,renderQuad::position);
    __return_storage_ptr__ = &vertexArrays[0].pointer.data;
    local_d0 = __return_storage_ptr__;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"a_texcoord",(allocator<char> *)((long)&gl + 7));
    glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_128,2,4,0,texCoord);
    gl._6_1_ = 0;
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    lStack_138 = CONCAT44(extraout_var,iVar2);
    this_01 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator->(&(this->m_gatherProgram).
                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        );
    local_13c = glu::ShaderProgram::getProgram(this_01);
    (**(code **)(lStack_138 + 0x1680))(local_13c);
    pcVar1 = *(code **)(lStack_138 + 0x14f0);
    uVar3 = (**(code **)(lStack_138 + 0xb48))(local_13c,"u_sampler");
    (*pcVar1)(uVar3,0);
    if ((this->m_useShadowSampler & 1U) != 0) {
      pcVar1 = *(code **)(lStack_138 + 0x14e0);
      uVar3 = (**(code **)(lStack_138 + 0xb48))(local_13c,"u_ref");
      (*pcVar1)((samplerParams->super_RenderParams).ref,uVar3);
    }
    pcVar1 = *(code **)(lStack_138 + 0x15a8);
    uVar3 = (**(code **)(lStack_138 + 0xb48))(local_13c,"u_colorScale");
    pfVar5 = tcu::Vector<float,_4>::getPtr(&(samplerParams->super_RenderParams).colorScale);
    (*pcVar1)(uVar3,1,pfVar5);
    pcVar1 = *(code **)(lStack_138 + 0x15a8);
    uVar3 = (**(code **)(lStack_138 + 0xb48))(local_13c,"u_colorBias");
    pfVar5 = tcu::Vector<float,_4>::getPtr(&(samplerParams->super_RenderParams).colorBias);
    (*pcVar1)(uVar3,1,pfVar5);
    pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
    program = local_13c;
    glu::pr::Triangles(&local_158,6,renderQuad::indices);
    glu::draw(pRVar4,program,2,(VertexArrayBinding *)local_c8,&local_158,(DrawUtilCallback *)0x0);
    local_200 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
    do {
      local_200 = local_200 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_200);
    } while (local_200 != (VertexArrayBinding *)local_c8);
  }
  return;
}

Assistant:

void TextureBorderClampTest::renderQuad (const float* texCoord, const glu::TextureTestUtil::ReferenceParams& samplerParams)
{
	// use TextureRenderer for basic rendering, use custom for gather
	if (m_samplingFunction == SAMPLE_FILTER)
		m_renderer->renderQuad(0, texCoord, samplerParams);
	else
	{
		static const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		static const deUint16 indices[] =
		{
			0, 1, 2, 2, 1, 3
		};
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4,	4, 0, &position[0]),
			glu::va::Float("a_texcoord",	2,	4, 0, texCoord)
		};

		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const deUint32			progId	= m_gatherProgram->getProgram();

		gl.useProgram(progId);
		gl.uniform1i(gl.getUniformLocation(progId, "u_sampler"), 0);
		if (m_useShadowSampler)
			gl.uniform1f(gl.getUniformLocation(progId, "u_ref"), samplerParams.ref);
		gl.uniform4fv(gl.getUniformLocation(progId, "u_colorScale"), 1, samplerParams.colorScale.getPtr());
		gl.uniform4fv(gl.getUniformLocation(progId, "u_colorBias"), 1, samplerParams.colorBias.getPtr());

		glu::draw(m_context.getRenderContext(), progId, DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}
}